

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::parseIf(StructuralParser *this)

{
  bool bVar1;
  Expression *pEVar2;
  Block *o;
  IfStatement *pIVar3;
  pool_ptr<soul::AST::Statement> local_78;
  char *local_70;
  pool_ptr<soul::AST::Statement> local_68;
  pool_ptr<soul::AST::Statement> falseBranch;
  Block *trueBranch;
  Expression *condition;
  bool local_29;
  undefined1 local_28 [7];
  bool isConst;
  Context context;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)this;
  getContext((Context *)local_28,this);
  local_29 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
             ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d002e);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d4496);
  pEVar2 = parseExpression(this,false);
  pEVar2 = matchCloseParen(this,pEVar2);
  falseBranch.object = &parseStatementAsNewBlock(this)->super_Statement;
  pool_ptr<soul::AST::Statement>::pool_ptr(&local_68);
  local_70 = "else";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"else");
  if (bVar1) {
    o = parseStatementAsNewBlock(this);
    pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Block,void>(&local_78,o);
    local_68.object = local_78.object;
    pool_ptr<soul::AST::Statement>::~pool_ptr(&local_78);
  }
  pIVar3 = allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
                     (this,(Context *)local_28,&local_29,pEVar2,(Block *)falseBranch.object,
                      &local_68);
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_68);
  AST::Context::~Context((Context *)local_28);
  return &pIVar3->super_Statement;
}

Assistant:

AST::Statement& parseIf()
    {
        auto context = getContext();
        bool isConst = matchIf (Keyword::const_);
        expect (Operator::openParen);
        auto& condition = matchCloseParen (parseExpression());
        auto& trueBranch = parseStatementAsNewBlock();
        pool_ptr<AST::Statement> falseBranch;

        if (matchIf (Keyword::else_))
            falseBranch = parseStatementAsNewBlock();

        return allocate<AST::IfStatement> (context, isConst, condition, trueBranch, falseBranch);
    }